

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_quantizer.cpp
# Opt level: O2

float __thiscall LumaQuantizer::quantize(LumaQuantizer *this,float val,uint ch)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  uint uVar6;
  float fVar7;
  undefined4 extraout_XMM0_Db;
  uint in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  uint in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint in_XMM3_Dc;
  uint in_XMM3_Dd;
  
  if ((ch == 0) || ((this->m_colorSpace | CS_YCBCR) == CS_XYZ)) {
    pfVar1 = this->m_mapping;
    uVar4 = this->m_maxVal;
    uVar6 = 0;
    while (uVar5 = uVar6, (int)(uVar5 + 1) < (int)uVar4) {
      uVar6 = uVar5 + uVar4 >> 1;
      if (val < pfVar1[uVar6]) {
        uVar4 = uVar6;
        uVar6 = uVar5;
      }
    }
    uVar6 = -(uint)(val - pfVar1[uVar5] < pfVar1[(int)uVar4] - val);
    auVar8._0_4_ = ~uVar6 & (uint)(float)(int)uVar4;
    auVar8._4_4_ = 0;
    auVar8._8_4_ = ~in_XMM0_Dc & in_XMM3_Dc;
    auVar8._12_4_ = ~in_XMM0_Dd & in_XMM3_Dd;
    auVar2._4_4_ = 0;
    auVar2._0_4_ = (uint)(float)uVar5 & uVar6;
    auVar2._8_4_ = in_XMM0_Dc;
    auVar2._12_4_ = in_XMM0_Dd;
    auVar9 = auVar8 | auVar2;
  }
  else {
    auVar10._0_4_ = (float)this->m_maxValColor;
    fVar7 = floorf(val * auVar10._0_4_ + 0.5);
    auVar9._4_4_ = extraout_XMM0_Db;
    auVar9._0_4_ = fVar7;
    auVar9._8_4_ = extraout_XMM0_Dc;
    auVar9._12_4_ = extraout_XMM0_Dd;
    if (auVar10._0_4_ <= fVar7) {
      auVar10._4_12_ = auVar9._4_12_;
      auVar9 = auVar10;
    }
    if (auVar9._0_4_ <= 0.0) {
      auVar3._12_4_ = 0;
      auVar3._0_12_ = auVar9._4_12_;
      auVar9 = auVar3 << 0x20;
    }
  }
  return auVar9._0_4_;
}

Assistant:

float LumaQuantizer::quantize(const float val, const unsigned int ch) const
{
    float res;
    
	if (ch == 0 || m_colorSpace == CS_RGB || m_colorSpace == CS_XYZ)
    {
	    //binary search for best fitting luminance
	    int l = 0, r = m_maxVal;
	    while( l+1 < r )
	    {
		    int m = (l+r)/2;
		    if( val < m_mapping[m] )
			    r = m;
		    else
			    l = m;
	    }
	    //assert( r - l == 1 );
	    if ( val - m_mapping[l] < m_mapping[r] - val )
		    res = (float)l;
	    else
		    res = (float)r;
	}
	else
	{
	    res = floor(m_maxValColor*val + 0.5f);
        res = std::max(0.0f, std::min((float)m_maxValColor, res));
    }
	
	return res;
}